

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

VecZNode * new_VecZNode(VecVecZNode *paths,int n,int parent)

{
  uint uVar1;
  ZNode **ppZVar2;
  VecZNode *v;
  ZNode *pZVar3;
  ulong uVar4;
  
  if (paths->n == 0) {
    v = &path1;
  }
  else {
    v = (VecZNode *)malloc(0x28);
  }
  v->n = 0;
  v->v = (ZNode **)0x0;
  if (0 < n && -1 < parent) {
    uVar4 = 0;
    do {
      ppZVar2 = v->v;
      if (ppZVar2 == (ZNode **)0x0) {
        pZVar3 = paths->v[(uint)parent]->v[uVar4];
        v->v = v->e;
        uVar1 = v->n;
        v->n = uVar1 + 1;
        v->e[uVar1] = pZVar3;
      }
      else {
        uVar1 = v->n;
        if (ppZVar2 == v->e) {
          if (2 < uVar1) goto LAB_0012bbb2;
          pZVar3 = paths->v[(uint)parent]->v[uVar4];
        }
        else {
          if ((uVar1 & 7) == 0) {
LAB_0012bbb2:
            vec_add_internal(v,paths->v[(uint)parent]->v[uVar4]);
            goto LAB_0012bbca;
          }
          pZVar3 = paths->v[(uint)parent]->v[uVar4];
        }
        v->n = uVar1 + 1;
        ppZVar2[uVar1] = pZVar3;
      }
LAB_0012bbca:
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  return v;
}

Assistant:

static VecZNode *new_VecZNode(VecVecZNode *paths, int n, int parent) {
  int i;
  VecZNode *pv;

  if (!paths->n)
    pv = &path1;
  else
    pv = MALLOC(sizeof *pv);
  vec_clear(pv);
  if (parent >= 0)
    for (i = 0; i < n; i++) vec_add(pv, paths->v[parent]->v[i]);
  return pv;
}